

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# I64ToI32Lowering.cpp
# Opt level: O0

void __thiscall wasm::I64ToI32Lowering::visitBinary(I64ToI32Lowering *this,Binary *curr)

{
  bool bVar1;
  Index IVar2;
  pointer pBVar3;
  LocalSet *append;
  LocalSet *any;
  Block *pBVar4;
  ostream *this_00;
  void *this_01;
  Block *result;
  LocalSet *setLeft;
  LocalSet *setRight;
  TempVar rightHigh;
  undefined1 local_90 [8];
  TempVar rightLow;
  undefined1 local_60 [8];
  TempVar leftHigh;
  undefined1 local_38 [8];
  TempVar leftLow;
  Binary *curr_local;
  I64ToI32Lowering *this_local;
  
  leftLow.ty.id = (uintptr_t)curr;
  bVar1 = handleUnreachable(this,(Expression *)curr);
  if ((!bVar1) && (bVar1 = binaryNeedsLowering(this,*(BinaryOp *)(leftLow.ty.id + 0x10)), bVar1)) {
    wasm::Type::Type(&leftHigh.ty,i32);
    getTemp((TempVar *)local_38,this,leftHigh.ty);
    fetchOutParam((TempVar *)local_60,this,*(Expression **)(leftLow.ty.id + 0x18));
    wasm::Type::Type(&rightHigh.ty,i32);
    getTemp((TempVar *)local_90,this,rightHigh.ty);
    fetchOutParam((TempVar *)&setRight,this,*(Expression **)(leftLow.ty.id + 0x20));
    pBVar3 = std::unique_ptr<wasm::Builder,_std::default_delete<wasm::Builder>_>::operator->
                       (&this->builder);
    IVar2 = TempVar::operator_cast_to_unsigned_int((TempVar *)local_90);
    append = Builder::makeLocalSet(pBVar3,IVar2,*(Expression **)(leftLow.ty.id + 0x20));
    pBVar3 = std::unique_ptr<wasm::Builder,_std::default_delete<wasm::Builder>_>::operator->
                       (&this->builder);
    IVar2 = TempVar::operator_cast_to_unsigned_int((TempVar *)local_38);
    any = Builder::makeLocalSet(pBVar3,IVar2,*(Expression **)(leftLow.ty.id + 0x18));
    pBVar3 = std::unique_ptr<wasm::Builder,_std::default_delete<wasm::Builder>_>::operator->
                       (&this->builder);
    pBVar4 = Builder::blockify(pBVar3,(Expression *)any,(Expression *)append);
    switch(*(undefined4 *)(leftLow.ty.id + 0x10)) {
    case 0x19:
      pBVar4 = lowerAdd(this,pBVar4,(TempVar *)local_38,(TempVar *)local_60,(TempVar *)local_90,
                        (TempVar *)&setRight);
      Walker<wasm::I64ToI32Lowering,_wasm::Visitor<wasm::I64ToI32Lowering,_void>_>::replaceCurrent
                (&(this->
                  super_WalkerPass<wasm::PostWalker<wasm::I64ToI32Lowering,_wasm::Visitor<wasm::I64ToI32Lowering,_void>_>_>
                  ).
                  super_PostWalker<wasm::I64ToI32Lowering,_wasm::Visitor<wasm::I64ToI32Lowering,_void>_>
                  .
                  super_Walker<wasm::I64ToI32Lowering,_wasm::Visitor<wasm::I64ToI32Lowering,_void>_>
                 ,(Expression *)pBVar4);
      break;
    case 0x1a:
      pBVar4 = lowerSub(this,pBVar4,(TempVar *)local_38,(TempVar *)local_60,(TempVar *)local_90,
                        (TempVar *)&setRight);
      Walker<wasm::I64ToI32Lowering,_wasm::Visitor<wasm::I64ToI32Lowering,_void>_>::replaceCurrent
                (&(this->
                  super_WalkerPass<wasm::PostWalker<wasm::I64ToI32Lowering,_wasm::Visitor<wasm::I64ToI32Lowering,_void>_>_>
                  ).
                  super_PostWalker<wasm::I64ToI32Lowering,_wasm::Visitor<wasm::I64ToI32Lowering,_void>_>
                  .
                  super_Walker<wasm::I64ToI32Lowering,_wasm::Visitor<wasm::I64ToI32Lowering,_void>_>
                 ,(Expression *)pBVar4);
      break;
    case 0x1b:
    case 0x1c:
    case 0x1d:
    case 0x1e:
    case 0x1f:
    case 0x26:
    case 0x27:
      handle_unreachable("should have been removed by now",
                         "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/passes/I64ToI32Lowering.cpp"
                         ,0x5ce);
    case 0x20:
    case 0x21:
    case 0x22:
      pBVar4 = lowerBitwise(this,*(BinaryOp *)(leftLow.ty.id + 0x10),pBVar4,(TempVar *)local_38,
                            (TempVar *)local_60,(TempVar *)local_90,(TempVar *)&setRight);
      Walker<wasm::I64ToI32Lowering,_wasm::Visitor<wasm::I64ToI32Lowering,_void>_>::replaceCurrent
                (&(this->
                  super_WalkerPass<wasm::PostWalker<wasm::I64ToI32Lowering,_wasm::Visitor<wasm::I64ToI32Lowering,_void>_>_>
                  ).
                  super_PostWalker<wasm::I64ToI32Lowering,_wasm::Visitor<wasm::I64ToI32Lowering,_void>_>
                  .
                  super_Walker<wasm::I64ToI32Lowering,_wasm::Visitor<wasm::I64ToI32Lowering,_void>_>
                 ,(Expression *)pBVar4);
      break;
    case 0x23:
    case 0x24:
    case 0x25:
      pBVar4 = lowerShift(this,*(BinaryOp *)(leftLow.ty.id + 0x10),pBVar4,(TempVar *)local_38,
                          (TempVar *)local_60,(TempVar *)local_90,(TempVar *)&setRight);
      Walker<wasm::I64ToI32Lowering,_wasm::Visitor<wasm::I64ToI32Lowering,_void>_>::replaceCurrent
                (&(this->
                  super_WalkerPass<wasm::PostWalker<wasm::I64ToI32Lowering,_wasm::Visitor<wasm::I64ToI32Lowering,_void>_>_>
                  ).
                  super_PostWalker<wasm::I64ToI32Lowering,_wasm::Visitor<wasm::I64ToI32Lowering,_void>_>
                  .
                  super_Walker<wasm::I64ToI32Lowering,_wasm::Visitor<wasm::I64ToI32Lowering,_void>_>
                 ,(Expression *)pBVar4);
      break;
    case 0x28:
      pBVar4 = lowerEq(this,pBVar4,(TempVar *)local_38,(TempVar *)local_60,(TempVar *)local_90,
                       (TempVar *)&setRight);
      Walker<wasm::I64ToI32Lowering,_wasm::Visitor<wasm::I64ToI32Lowering,_void>_>::replaceCurrent
                (&(this->
                  super_WalkerPass<wasm::PostWalker<wasm::I64ToI32Lowering,_wasm::Visitor<wasm::I64ToI32Lowering,_void>_>_>
                  ).
                  super_PostWalker<wasm::I64ToI32Lowering,_wasm::Visitor<wasm::I64ToI32Lowering,_void>_>
                  .
                  super_Walker<wasm::I64ToI32Lowering,_wasm::Visitor<wasm::I64ToI32Lowering,_void>_>
                 ,(Expression *)pBVar4);
      break;
    case 0x29:
      pBVar4 = lowerNe(this,pBVar4,(TempVar *)local_38,(TempVar *)local_60,(TempVar *)local_90,
                       (TempVar *)&setRight);
      Walker<wasm::I64ToI32Lowering,_wasm::Visitor<wasm::I64ToI32Lowering,_void>_>::replaceCurrent
                (&(this->
                  super_WalkerPass<wasm::PostWalker<wasm::I64ToI32Lowering,_wasm::Visitor<wasm::I64ToI32Lowering,_void>_>_>
                  ).
                  super_PostWalker<wasm::I64ToI32Lowering,_wasm::Visitor<wasm::I64ToI32Lowering,_void>_>
                  .
                  super_Walker<wasm::I64ToI32Lowering,_wasm::Visitor<wasm::I64ToI32Lowering,_void>_>
                 ,(Expression *)pBVar4);
      break;
    case 0x2a:
    case 0x2c:
    case 0x2e:
    case 0x30:
      pBVar4 = lowerSComp(this,*(BinaryOp *)(leftLow.ty.id + 0x10),pBVar4,(TempVar *)local_38,
                          (TempVar *)local_60,(TempVar *)local_90,(TempVar *)&setRight);
      Walker<wasm::I64ToI32Lowering,_wasm::Visitor<wasm::I64ToI32Lowering,_void>_>::replaceCurrent
                (&(this->
                  super_WalkerPass<wasm::PostWalker<wasm::I64ToI32Lowering,_wasm::Visitor<wasm::I64ToI32Lowering,_void>_>_>
                  ).
                  super_PostWalker<wasm::I64ToI32Lowering,_wasm::Visitor<wasm::I64ToI32Lowering,_void>_>
                  .
                  super_Walker<wasm::I64ToI32Lowering,_wasm::Visitor<wasm::I64ToI32Lowering,_void>_>
                 ,(Expression *)pBVar4);
      break;
    case 0x2b:
    case 0x2d:
    case 0x2f:
    case 0x31:
      pBVar4 = lowerUComp(this,*(BinaryOp *)(leftLow.ty.id + 0x10),pBVar4,(TempVar *)local_38,
                          (TempVar *)local_60,(TempVar *)local_90,(TempVar *)&setRight);
      Walker<wasm::I64ToI32Lowering,_wasm::Visitor<wasm::I64ToI32Lowering,_void>_>::replaceCurrent
                (&(this->
                  super_WalkerPass<wasm::PostWalker<wasm::I64ToI32Lowering,_wasm::Visitor<wasm::I64ToI32Lowering,_void>_>_>
                  ).
                  super_PostWalker<wasm::I64ToI32Lowering,_wasm::Visitor<wasm::I64ToI32Lowering,_void>_>
                  .
                  super_Walker<wasm::I64ToI32Lowering,_wasm::Visitor<wasm::I64ToI32Lowering,_void>_>
                 ,(Expression *)pBVar4);
      break;
    default:
      this_00 = std::operator<<((ostream *)&std::cerr,"Unhandled binary op ");
      this_01 = (void *)std::ostream::operator<<(this_00,*(int *)(leftLow.ty.id + 0x10));
      std::ostream::operator<<(this_01,std::endl<char,std::char_traits<char>>);
      abort();
    }
    TempVar::~TempVar((TempVar *)&setRight);
    TempVar::~TempVar((TempVar *)local_90);
    TempVar::~TempVar((TempVar *)local_60);
    TempVar::~TempVar((TempVar *)local_38);
  }
  return;
}

Assistant:

void visitBinary(Binary* curr) {
    if (handleUnreachable(curr)) {
      return;
    }
    if (!binaryNeedsLowering(curr->op)) {
      return;
    }
    // left and right reachable, lower normally
    TempVar leftLow = getTemp();
    TempVar leftHigh = fetchOutParam(curr->left);
    TempVar rightLow = getTemp();
    TempVar rightHigh = fetchOutParam(curr->right);
    LocalSet* setRight = builder->makeLocalSet(rightLow, curr->right);
    LocalSet* setLeft = builder->makeLocalSet(leftLow, curr->left);
    Block* result = builder->blockify(setLeft, setRight);
    switch (curr->op) {
      case AddInt64: {
        replaceCurrent(lowerAdd(result,
                                std::move(leftLow),
                                std::move(leftHigh),
                                std::move(rightLow),
                                std::move(rightHigh)));
        break;
      }
      case SubInt64: {
        replaceCurrent(lowerSub(result,
                                std::move(leftLow),
                                std::move(leftHigh),
                                std::move(rightLow),
                                std::move(rightHigh)));
        break;
      }
      case MulInt64:
      case DivSInt64:
      case DivUInt64:
      case RemSInt64:
      case RemUInt64:
      case RotLInt64:
      case RotRInt64:
        WASM_UNREACHABLE("should have been removed by now");

      case AndInt64:
      case OrInt64:
      case XorInt64: {
        replaceCurrent(lowerBitwise(curr->op,
                                    result,
                                    std::move(leftLow),
                                    std::move(leftHigh),
                                    std::move(rightLow),
                                    std::move(rightHigh)));
        break;
      }
      case ShlInt64:
      case ShrSInt64:
      case ShrUInt64: {
        replaceCurrent(lowerShift(curr->op,
                                  result,
                                  std::move(leftLow),
                                  std::move(leftHigh),
                                  std::move(rightLow),
                                  std::move(rightHigh)));
        break;
      }
      case EqInt64: {
        replaceCurrent(lowerEq(result,
                               std::move(leftLow),
                               std::move(leftHigh),
                               std::move(rightLow),
                               std::move(rightHigh)));
        break;
      }
      case NeInt64: {
        replaceCurrent(lowerNe(result,
                               std::move(leftLow),
                               std::move(leftHigh),
                               std::move(rightLow),
                               std::move(rightHigh)));
        break;
      }
      case LtSInt64:
      case LeSInt64:
      case GtSInt64:
      case GeSInt64:
        replaceCurrent(lowerSComp(curr->op,
                                  result,
                                  std::move(leftLow),
                                  std::move(leftHigh),
                                  std::move(rightLow),
                                  std::move(rightHigh)));
        break;
      case LtUInt64:
      case LeUInt64:
      case GtUInt64:
      case GeUInt64: {
        replaceCurrent(lowerUComp(curr->op,
                                  result,
                                  std::move(leftLow),
                                  std::move(leftHigh),
                                  std::move(rightLow),
                                  std::move(rightHigh)));
        break;
      }
      default: {
        std::cerr << "Unhandled binary op " << curr->op << std::endl;
        abort();
      }
    }
  }